

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::InternalSwap
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  RepeatedField<unsigned_int> *local_18;
  RepeatedField<unsigned_int> *other_local;
  RepeatedField<unsigned_int> *this_local;
  
  local_51 = 0;
  local_18 = other;
  other_local = this;
  if (this == other) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e8);
    local_51 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    internal::LogFinisher::operator=(local_65,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  pAVar1 = GetArenaNoVirtual(this);
  pAVar2 = GetArenaNoVirtual(local_18);
  local_a1 = 0;
  if (pAVar1 != pAVar2) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4e9);
    local_a1 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: GetArenaNoVirtual() == other->GetArenaNoVirtual(): ");
    internal::LogFinisher::operator=(&local_a2,pLVar3);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  std::swap<google::protobuf::RepeatedField<unsigned_int>::Rep*>(&this->rep_,&local_18->rep_);
  std::swap<int>(&this->current_size_,&local_18->current_size_);
  std::swap<int>(&this->total_size_,&local_18->total_size_);
  return;
}

Assistant:

inline void RepeatedField<Element>::InternalSwap(RepeatedField* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());

  std::swap(rep_, other->rep_);
  std::swap(current_size_, other->current_size_);
  std::swap(total_size_, other->total_size_);
}